

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::TrySetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,LayeredTextureMap *layeredTextures,
          string *propName,aiTextureType target,MeshGeometry *mesh)

{
  long lVar1;
  Texture *tex;
  pointer ppaVar2;
  aiTextureType type;
  bool bVar3;
  __type _Var4;
  PropertyTable *this_00;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_> _Var5;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar6;
  MeshGeometry *this_01;
  MatIndexArray *pMVar7;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  _Rb_tree_node_base *p_Var9;
  uint i_1;
  uint i;
  uint uVar10;
  undefined1 useTemplate;
  ulong uVar11;
  ulong uVar12;
  int uvIndex;
  bool ok;
  aiTextureType local_674;
  aiMaterial *out_mat_local;
  FBXConverter *local_668;
  uint matIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  MeshGeometry *local_618;
  _Base_ptr local_610;
  ulong local_608;
  ulong local_600;
  _Rb_tree_node_base *local_5f8;
  int blendmode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  aiUVTransform local_5c8;
  PropertyTable local_5b0 [3];
  aiString path;
  
  out_mat_local = out_mat;
  local_610 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
              ::find(&layeredTextures->_M_t,propName);
  if ((_Rb_tree_header *)local_610 != &(layeredTextures->_M_t)._M_impl.super__Rb_tree_header) {
    lVar1 = *(long *)(local_610 + 2);
    uVar12 = (ulong)(*(long *)(lVar1 + 0x40) - *(long *)(lVar1 + 0x38)) >> 3;
    blendmode = *(int *)(lVar1 + 0x50);
    uVar11 = 0;
    local_674 = target;
    aiMaterial::AddProperty(out_mat,&blendmode,1,"$tex.op",target,0);
    local_5f8 = &(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_608 = uVar12 & 0xffffffff;
    if ((int)uVar12 < 1) {
      local_608 = uVar11;
    }
    local_668 = this;
    local_618 = mesh;
    for (; uVar11 != local_608; uVar11 = uVar11 + 1) {
      tex = *(Texture **)(*(long *)(*(long *)(local_610 + 2) + 0x38) + uVar11 * 8);
      GetTexturePath(&path,local_668,tex);
      type = local_674;
      aiMaterial::AddProperty(out_mat_local,&path,"$tex.file",local_674,(uint)uVar11);
      local_5c8.mRotation = 0.0;
      local_5c8.mTranslation = tex->uvTrans;
      local_5c8.mScaling = tex->uvScaling;
      useTemplate = (undefined1)uVar11;
      local_600 = uVar11;
      aiMaterial::AddProperty(out_mat_local,&local_5c8,1,"$tex.uvtrafo",type,(uint)uVar11);
      this_00 = Texture::Props(tex);
      uvIndex = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_5b0,"UVSet",(allocator<char> *)&local_5e8);
      PropertyGet<std::__cxx11::string>
                (&local_658,(FBX *)this_00,local_5b0,(string *)&ok,(bool *)0x0,(bool)useTemplate);
      std::__cxx11::string::~string((string *)local_5b0);
      if (((ok == true) && (bVar3 = std::operator!=(&local_658,"default"), bVar3)) &&
         (local_658._M_string_length != 0)) {
        ppaVar2 = (local_668->materials).
                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiMaterial*const>>
                          (ppaVar2,(local_668->materials).
                                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&out_mat_local);
        uvIndex = -1;
        matIndex = (uint)((ulong)((long)_Var5._M_current - (long)ppaVar2) >> 3);
        if (mesh == (MeshGeometry *)0x0) {
          for (p_Var9 = (local_668->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left; mesh = local_618, uVar10 = uvIndex, p_Var9 != local_5f8;
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
            if ((*(long *)(p_Var9 + 1) != 0) &&
               (this_01 = (MeshGeometry *)
                          __dynamic_cast(*(long *)(p_Var9 + 1),&Geometry::typeinfo,
                                         &MeshGeometry::typeinfo,0), uVar10 = uvIndex,
               this_01 != (MeshGeometry *)0x0)) {
              pMVar7 = MeshGeometry::GetMaterialIndices(this_01);
              _Var8 = std::
                      __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                ((pMVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start,
                                 (pMVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish,&matIndex);
              uVar10 = uvIndex;
              if (_Var8._M_current !=
                  (pMVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                uVar10 = 0;
                while ((uVar10 != 8 &&
                       (pvVar6 = MeshGeometry::GetTextureCoords(this_01,uVar10),
                       (pvVar6->
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start !=
                       (pvVar6->
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish))) {
                  MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                            ((string *)local_5b0,this_01,uVar10);
                  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_5b0,&local_658);
                  std::__cxx11::string::~string((string *)local_5b0);
                  if (_Var4) {
                    if (uvIndex == -1) goto LAB_00505398;
                    std::operator+(&local_638,"the UV channel named ",&local_658);
                    std::operator+(&local_5e8,&local_638,
                                   " appears at different positions in meshes, results will be wrong"
                                  );
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    basic_formatter<std::__cxx11::string>
                              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               local_5b0,&local_5e8);
                    LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
                    goto LAB_0050537e;
                  }
                  uVar10 = uVar10 + 1;
                }
                std::operator+(&local_638,"did not find UV channel named ",&local_658);
                std::operator+(&local_5e8,&local_638," in a mesh using this material");
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                basic_formatter<std::__cxx11::string>
                          ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           local_5b0,&local_5e8);
                LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
LAB_0050537e:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
                std::__cxx11::string::~string((string *)&local_5e8);
                std::__cxx11::string::~string((string *)&local_638);
                uVar10 = uvIndex;
              }
            }
LAB_00505398:
            uvIndex = uVar10;
          }
        }
        else {
          uVar10 = 0;
          while ((uVar10 != 8 &&
                 (pvVar6 = MeshGeometry::GetTextureCoords(mesh,uVar10),
                 (pvVar6->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start !=
                 (pvVar6->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish))) {
            MeshGeometry::GetTextureCoordChannelName_abi_cxx11_((string *)local_5b0,mesh,uVar10);
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_5b0,&local_658);
            std::__cxx11::string::~string((string *)local_5b0);
            if (_Var4) goto LAB_00505229;
            uVar10 = uVar10 + 1;
          }
          std::operator+(&local_638,"did not find UV channel named ",&local_658);
          std::operator+(&local_5e8,&local_638," in a mesh using this material");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_5b0,
                     &local_5e8);
          LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::__cxx11::string::~string((string *)&local_638);
          uVar10 = 0xffffffff;
LAB_00505229:
          if (uvIndex != -1) goto LAB_00505417;
        }
        uvIndex = uVar10;
        if (uvIndex == -1) {
          std::operator+(&local_638,"failed to resolve UV channel ",&local_658);
          std::operator+(&local_5e8,&local_638,", using first UV channel");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_5b0,
                     &local_5e8);
          LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::__cxx11::string::~string((string *)&local_638);
          uvIndex = 0;
        }
      }
LAB_00505417:
      uVar11 = local_600;
      aiMaterial::AddProperty(out_mat_local,&uvIndex,1,"$tex.uvwsrc",local_674,(uint)local_600);
      std::__cxx11::string::~string((string *)&local_658);
    }
  }
  return;
}

Assistant:

void FBXConverter::TrySetTextureProperties(aiMaterial* out_mat, const LayeredTextureMap& layeredTextures,
            const std::string& propName,
            aiTextureType target, const MeshGeometry* const mesh) {
            LayeredTextureMap::const_iterator it = layeredTextures.find(propName);
            if (it == layeredTextures.end()) {
                return;
            }

            int texCount = (*it).second->textureCount();

            // Set the blend mode for layered textures
            int blendmode = (*it).second->GetBlendMode();
            out_mat->AddProperty(&blendmode, 1, _AI_MATKEY_TEXOP_BASE, target, 0);

            for (int texIndex = 0; texIndex < texCount; texIndex++) {

                const Texture* const tex = (*it).second->getTexture(texIndex);

                aiString path = GetTexturePath(tex);
                out_mat->AddProperty(&path, _AI_MATKEY_TEXTURE_BASE, target, texIndex);

                aiUVTransform uvTrafo;
                // XXX handle all kinds of UV transformations
                uvTrafo.mScaling = tex->UVScaling();
                uvTrafo.mTranslation = tex->UVTranslation();
                out_mat->AddProperty(&uvTrafo, 1, _AI_MATKEY_UVTRANSFORM_BASE, target, texIndex);

                const PropertyTable& props = tex->Props();

                int uvIndex = 0;

                bool ok;
                const std::string& uvSet = PropertyGet<std::string>(props, "UVSet", ok);
                if (ok) {
                    // "default" is the name which usually appears in the FbxFileTexture template
                    if (uvSet != "default" && uvSet.length()) {
                        // this is a bit awkward - we need to find a mesh that uses this
                        // material and scan its UV channels for the given UV name because
                        // assimp references UV channels by index, not by name.

                        // XXX: the case that UV channels may appear in different orders
                        // in meshes is unhandled. A possible solution would be to sort
                        // the UV channels alphabetically, but this would have the side
                        // effect that the primary (first) UV channel would sometimes
                        // be moved, causing trouble when users read only the first
                        // UV channel and ignore UV channel assignments altogether.

                        const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(),
                            std::find(materials.begin(), materials.end(), out_mat)
                        ));

                        uvIndex = -1;
                        if (!mesh)
                        {
                            for (const MeshMap::value_type& v : meshes_converted) {
                                const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*> (v.first);
                                if (!meshGeom) {
                                    continue;
                                }

                                const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                                if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                    continue;
                                }

                                int index = -1;
                                for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                    if (meshGeom->GetTextureCoords(i).empty()) {
                                        break;
                                    }
                                    const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                    if (name == uvSet) {
                                        index = static_cast<int>(i);
                                        break;
                                    }
                                }
                                if (index == -1) {
                                    FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                    continue;
                                }

                                if (uvIndex == -1) {
                                    uvIndex = index;
                                }
                                else {
                                    FBXImporter::LogWarn("the UV channel named " + uvSet +
                                        " appears at different positions in meshes, results will be wrong");
                                }
                            }
                        }
                        else
                        {
                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (mesh->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = mesh->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                        }

                        if (uvIndex == -1) {
                            FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                            uvIndex = 0;
                        }
                    }
                }

                out_mat->AddProperty(&uvIndex, 1, _AI_MATKEY_UVWSRC_BASE, target, texIndex);
            }
        }